

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

u32 recalculate_min_match_len(deflate_freqs *freqs,u32 max_search_depth)

{
  u32 uVar1;
  u32 in_ESI;
  long in_RDI;
  int i;
  u32 num_used_literals;
  u32 cutoff;
  u32 literal_freq;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_10;
  
  local_10 = 0;
  local_18 = 0;
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    local_10 = *(int *)(in_RDI + (long)local_1c * 4) + local_10;
  }
  for (local_1c = 0; local_1c < 0x100; local_1c = local_1c + 1) {
    if (local_10 >> 10 < *(uint *)(in_RDI + (long)local_1c * 4)) {
      local_18 = local_18 + 1;
    }
  }
  uVar1 = choose_min_match_len(local_18,in_ESI);
  return uVar1;
}

Assistant:

static u32
recalculate_min_match_len(const struct deflate_freqs *freqs,
			  u32 max_search_depth)
{
	u32 literal_freq = 0;
	u32 cutoff;
	u32 num_used_literals = 0;
	int i;

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++)
		literal_freq += freqs->litlen[i];

	cutoff = literal_freq >> 10; /* Ignore literals used very rarely. */

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++) {
		if (freqs->litlen[i] > cutoff)
			num_used_literals++;
	}
	return choose_min_match_len(num_used_literals, max_search_depth);
}